

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetFloat(ImGuiStorage *this,ImGuiID key,float val)

{
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_00;
  ImVector<ImGuiStorage::ImGuiStoragePair> *pIVar1;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  float in_XMM0_Da;
  ImGuiStoragePair *it;
  ImGuiStoragePair local_28;
  ImVector<ImGuiStorage::ImGuiStoragePair> *local_18;
  float local_10;
  ImGuiID local_c;
  
  local_10 = in_XMM0_Da;
  local_c = in_ESI;
  this_00 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)LowerBound(in_RDI,in_ESI);
  local_18 = this_00;
  pIVar1 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)
           ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((this_00 == pIVar1) || (local_18->Size != local_c)) {
    pIVar1 = local_18;
    ImGuiStoragePair::ImGuiStoragePair(&local_28,local_c,local_10);
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert
              (this_00,(ImGuiStoragePair *)in_RDI,(ImGuiStoragePair *)pIVar1);
  }
  else {
    ((anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)&local_18->Data)->val_f = local_10;
  }
  return;
}

Assistant:

void ImGuiStorage::SetFloat(ImGuiID key, float val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_f = val;
}